

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

string * __thiscall
cfd::core::KeyData::GetBip32Path_abi_cxx11_
          (string *__return_storage_ptr__,KeyData *this,HardenedType hardened_type,bool has_hex)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  reference puVar4;
  ostream *poVar5;
  uint local_1fc;
  uint32_t num;
  const_iterator cStack_1c8;
  uint child_num;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  stringstream local_1a8 [7];
  bool is_first;
  stringstream ss;
  ostream local_198 [379];
  byte local_1d;
  HardenedType local_1c;
  bool has_hex_local;
  KeyData *pKStack_18;
  HardenedType hardened_type_local;
  KeyData *this_local;
  
  local_1d = has_hex;
  local_1c = hardened_type;
  pKStack_18 = this;
  this_local = (KeyData *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  bVar2 = true;
  __end2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->path_);
  cStack_1c8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->path_);
  do {
    bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffe38);
    if (!bVar3) {
      ::std::__cxx11::stringstream::str();
      ::std::__cxx11::stringstream::~stringstream(local_1a8);
      return __return_storage_ptr__;
    }
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    uVar1 = *puVar4;
    if (!bVar2) {
      ::std::operator<<(local_198,"/");
    }
    local_1fc = uVar1;
    if (local_1c != kNumber) {
      local_1fc = uVar1 & 0x7fffffff;
    }
    if ((local_1d & 1) == 0) {
      ::std::ostream::operator<<(local_198,local_1fc);
    }
    else {
      poVar5 = ::std::operator<<(local_198,"0x");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,::std::hex);
      ::std::ostream::operator<<(poVar5,local_1fc);
    }
    if ((uVar1 & 0x80000000) != 0) {
      switch(local_1c) {
      case kApostrophe:
      default:
        ::std::operator<<(local_198,"\'");
        break;
      case kLargeH:
        ::std::operator<<(local_198,"H");
        break;
      case kSmallH:
        ::std::operator<<(local_198,"h");
        break;
      case kNumber:
      }
    }
    bVar2 = false;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

std::string KeyData::GetBip32Path(
    HardenedType hardened_type, bool has_hex) const {
  std::stringstream ss;
  bool is_first = true;
  for (auto child_num : path_) {
    if (!is_first) ss << "/";
    uint32_t num = (hardened_type == HardenedType::kNumber)
                       ? child_num
                       : (child_num & 0x7FFFFFFF);
    if (has_hex) {
      ss << "0x" << std::hex << num;
    } else {
      ss << num;
    }

    if (child_num & 0x80000000) {
      switch (hardened_type) {
        case kLargeH:
          ss << "H";
          break;
        case kSmallH:
          ss << "h";
          break;
        case kNumber:
          // do nothing
          break;
        case kApostrophe:
        default:
          ss << "'";
          break;
      }
    }
    is_first = false;
  }
  return ss.str();
}